

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void internal_counters_set_mgga(int nspin,xc_dimensions *dim)

{
  undefined4 uVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  internal_counters_set_gga(nspin,dim);
  dim->vlapl = nspin;
  dim->lapl = nspin;
  dim->vtau = nspin;
  dim->tau = nspin;
  if (nspin == 1) {
    dim->v2tau2 = 1;
    dim->v2lapl2 = 1;
    dim->v2lapltau = 1;
    dim->v2rholapl = 1;
    dim->v2rhotau = 1;
    local_38 = 0x11c;
    local_40 = 0x124;
    local_48 = 0x10c;
    local_50 = 0x110;
    local_58 = 0x114;
    local_60 = 0x118;
    local_68 = 0xfc;
    local_70 = 0x100;
    local_78 = 0x104;
    local_80 = 0x108;
    local_88 = 0xec;
    local_90 = 0xf0;
    local_98 = 0xf4;
    local_a0 = 0xf8;
    local_a8 = 0xdc;
    local_b0 = 0xe4;
    local_b8 = 0xe8;
    local_c0 = 0xd0;
    local_c8 = 0xd4;
    local_d0 = 0xd8;
    local_d8 = 0xc0;
    local_e0 = 0xc4;
    local_e8 = 200;
    local_f0 = 0xcc;
    local_f8 = 0xb0;
    local_100 = 0xb4;
    local_108 = 0xb8;
    local_110 = 0xbc;
    local_118 = 0x9c;
    local_120 = 0xa0;
    local_128 = 0xa4;
    local_130 = 0xa8;
    local_138 = 0xac;
    local_140 = 0x60;
    local_148 = 100;
    local_150 = 0x84;
    local_158 = 0x80;
    local_160 = 0x88;
    local_168 = 0x78;
    local_170 = 0x7c;
    local_178 = 0x70;
    local_180 = 0x90;
    local_188 = 0x94;
    local_190 = 0x6c;
    local_198 = 0x8c;
    local_1a0 = 0x98;
    local_1a8 = 0x54;
    lVar9 = 0x58;
    lVar11 = 0x68;
    lVar2 = 0x38;
    uVar4 = 1;
    lVar8 = 0x3c;
    uVar6 = 1;
    uVar7 = 1;
    iVar12 = 1;
    iVar13 = 1;
    uVar14 = 1;
    uVar1 = 1;
    uVar3 = 1;
    uVar5 = 1;
    uVar10 = 1;
  }
  else {
    dim->vlapl = 2;
    dim->vtau = 2;
    local_38 = 0x124;
    local_40 = 0x11c;
    local_48 = 0x118;
    uVar10 = 5;
    local_50 = 0x114;
    local_58 = 0x110;
    local_60 = 0x10c;
    local_68 = 0x108;
    local_70 = 0x104;
    local_78 = 0x100;
    local_80 = 0xfc;
    local_88 = 0xf8;
    local_90 = 0xf4;
    uVar5 = 0x14;
    local_98 = 0xf0;
    local_a0 = 0xe8;
    local_a8 = 0xe4;
    local_b0 = 0xdc;
    local_b8 = 0xd8;
    local_c0 = 0xd4;
    local_c8 = 0xd0;
    local_d0 = 0xcc;
    uVar3 = 0x18;
    local_d8 = 200;
    local_e0 = 0xc0;
    local_e8 = 0xbc;
    local_f0 = 0xb8;
    local_f8 = 0xb4;
    uVar1 = 0x12;
    local_100 = 0xb0;
    local_108 = 0xa8;
    local_110 = 0xa4;
    local_118 = 0x98;
    local_120 = 0x94;
    local_128 = 0x90;
    local_130 = 0x8c;
    local_138 = 0x88;
    local_140 = 0x84;
    uVar14 = 9;
    local_148 = 0x80;
    local_150 = 0x7c;
    local_158 = 0x78;
    local_160 = 0x70;
    iVar13 = 8;
    local_168 = 0x6c;
    local_170 = 0x68;
    local_178 = 100;
    iVar12 = 0xc;
    local_180 = 0x60;
    local_188 = 0x58;
    local_190 = 0x54;
    local_198 = 0x48;
    local_1a0 = 0x44;
    uVar7 = 3;
    local_1a8 = 0x40;
    lVar9 = 0x3c;
    uVar6 = 6;
    lVar11 = 0x38;
    lVar2 = 0x30;
    uVar4 = 4;
    lVar8 = 0x2c;
  }
  *(undefined4 *)((long)&dim->rho + lVar8) = uVar4;
  *(undefined4 *)((long)&dim->rho + lVar2) = uVar4;
  *(undefined4 *)((long)&dim->rho + lVar11) = uVar6;
  *(undefined4 *)((long)&dim->rho + lVar9) = uVar6;
  *(undefined4 *)((long)&dim->rho + local_1a8) = uVar7;
  *(undefined4 *)((long)&dim->rho + local_1a0) = uVar4;
  *(undefined4 *)((long)&dim->rho + local_198) = uVar7;
  *(undefined4 *)((long)&dim->rho + local_190) = uVar6;
  *(undefined4 *)((long)&dim->rho + local_188) = uVar6;
  *(int *)((long)&dim->rho + local_180) = iVar12;
  *(int *)((long)&dim->rho + local_178) = iVar12;
  *(undefined4 *)((long)&dim->rho + local_170) = uVar6;
  *(int *)((long)&dim->rho + local_168) = iVar13;
  *(undefined4 *)((long)&dim->rho + local_160) = uVar6;
  *(int *)((long)&dim->rho + local_158) = iVar12;
  *(int *)((long)&dim->rho + local_150) = iVar12;
  *(undefined4 *)((long)&dim->rho + local_148) = uVar14;
  *(int *)((long)&dim->rho + local_140) = iVar12;
  *(undefined4 *)((long)&dim->rho + local_138) = uVar14;
  *(undefined4 *)((long)&dim->rho + local_130) = uVar4;
  *(undefined4 *)((long)&dim->rho + local_128) = uVar6;
  *(undefined4 *)((long)&dim->rho + local_120) = uVar6;
  *(undefined4 *)((long)&dim->rho + local_118) = uVar4;
  *(int *)((long)&dim->rho + local_110) = iVar13;
  *(int *)((long)&dim->rho + local_108) = iVar13;
  *(undefined4 *)((long)&dim->rho + local_100) = uVar1;
  *(undefined4 *)((long)&dim->rho + local_f8) = uVar1;
  *(undefined4 *)((long)&dim->rho + local_f0) = uVar14;
  *(int *)((long)&dim->rho + local_e8) = iVar12;
  *(undefined4 *)((long)&dim->rho + local_e0) = uVar14;
  *(undefined4 *)((long)&dim->rho + local_d8) = uVar3;
  *(undefined4 *)((long)&dim->rho + local_d0) = uVar3;
  *(undefined4 *)((long)&dim->rho + local_c8) = uVar1;
  *(undefined4 *)((long)&dim->rho + local_c0) = uVar3;
  *(undefined4 *)((long)&dim->rho + local_b8) = uVar1;
  *(int *)((long)&dim->rho + local_b0) = iVar13;
  dim->v4rholapl2tau = iVar12;
  *(int *)((long)&dim->rho + local_a8) = iVar12;
  *(int *)((long)&dim->rho + local_a0) = iVar13;
  *(undefined4 *)((long)&dim->rho + local_98) = uVar5;
  *(undefined4 *)((long)&dim->rho + local_90) = uVar5;
  *(undefined4 *)((long)&dim->rho + local_88) = uVar1;
  *(undefined4 *)((long)&dim->rho + local_80) = uVar3;
  *(undefined4 *)((long)&dim->rho + local_78) = uVar1;
  *(int *)((long)&dim->rho + local_70) = iVar12;
  *(undefined4 *)((long)&dim->rho + local_68) = uVar1;
  *(undefined4 *)((long)&dim->rho + local_60) = uVar1;
  *(int *)((long)&dim->rho + local_58) = iVar12;
  *(undefined4 *)((long)&dim->rho + local_50) = uVar10;
  *(int *)((long)&dim->rho + local_48) = iVar13;
  *(undefined4 *)((long)&dim->rho + local_40) = uVar14;
  dim->v4lapltau3 = iVar13;
  *(undefined4 *)((long)&dim->rho + local_38) = uVar10;
  return;
}

Assistant:

void
internal_counters_set_mgga(int nspin, xc_dimensions *dim)
{
  internal_counters_set_gga(nspin, dim);
  dim->lapl = dim->vlapl = nspin;
  dim->tau  = dim->vtau  = nspin;

  if(nspin == XC_UNPOLARIZED){
    dim->v2lapl2 = dim->v2tau2 = 1;
    dim->v2rholapl = dim->v2rhotau = dim->v2lapltau = 1;
    dim->v2sigmalapl = dim->v2sigmatau = 1;

    dim->v3lapl3 = dim->v3tau3 = dim->v3rho2lapl = dim->v3rho2tau = dim->v3rholapl2 = 1;
    dim->v3rhotau2 = dim->v3lapl2tau = dim->v3lapltau2 = dim->v3rholapltau = 1;
    dim->v3sigmalapl2 = dim->v3sigmatau2 = dim->v3sigma2lapl = dim->v3sigma2tau = 1;
    dim->v3rhosigmalapl = dim->v3rhosigmatau = dim->v3sigmalapltau = 1;

    dim->v4rho4 = dim->v4rho3sigma = dim->v4rho3lapl = dim->v4rho3tau = dim->v4rho2sigma2 = 1;
    dim->v4rho2sigmalapl = dim->v4rho2sigmatau = dim->v4rho2lapl2 = dim->v4rho2lapltau = 1;
    dim->v4rho2tau2 = dim->v4rhosigma3 = dim->v4rhosigma2lapl = dim->v4rhosigma2tau = 1;
    dim->v4rhosigmalapl2 = dim->v4rhosigmalapltau = dim->v4rhosigmatau2 = 1;
    dim->v4rholapl3 = dim->v4rholapl2tau = dim->v4rholapltau2 = dim->v4rhotau3 = 1;
    dim->v4sigma4 = dim->v4sigma3lapl = dim->v4sigma3tau = dim->v4sigma2lapl2 = 1;
    dim->v4sigma2lapltau = dim->v4sigma2tau2 = dim->v4sigmalapl3 = dim->v4sigmalapl2tau = 1;
    dim->v4sigmalapltau2 = dim->v4sigmatau3 = dim->v4lapl4 = dim->v4lapl3tau = 1;
    dim->v4lapl2tau2 = dim->v4lapltau3 = dim->v4tau4 =1;
  }else{
    dim->vlapl             = 2;
    dim->vtau              = 2;

    /* in total: 30 */
    dim->v2rholapl         = 2*2;
    dim->v2rhotau          = 2*2;
    dim->v2sigmalapl       = 3*2;
    dim->v2sigmatau        = 3*2;
    dim->v2lapl2           = 3;
    dim->v2lapltau         = 2*2;
    dim->v2tau2            = 3;

    /* in total: 130 */
    dim->v3rho2lapl        = 3*2;
    dim->v3rho2tau         = 3*2;
    dim->v3rhosigmalapl    = 2*3*2;
    dim->v3rhosigmatau     = 2*3*2;
    dim->v3rholapl2        = 2*3;
    dim->v3rholapltau      = 2*2*2;
    dim->v3rhotau2         = 2*3;
    dim->v3sigma2lapl      = 6*2;
    dim->v3sigma2tau       = 6*2;
    dim->v3sigmalapl2      = 3*3;
    dim->v3sigmalapltau    = 3*2*2;
    dim->v3sigmatau2       = 3*3;
    dim->v3lapl3           = 4;
    dim->v3lapl2tau        = 3*2;
    dim->v3lapltau2        = 2*3;
    dim->v3tau3            = 4;

    /* in total: 425 */
    dim->v4rho3lapl        = 4*2;
    dim->v4rho3tau         = 4*2;
    dim->v4rho2sigmalapl   = 3*3*2;
    dim->v4rho2sigmatau    = 3*3*2;
    dim->v4rho2lapl2       = 3*3;
    dim->v4rho2lapltau     = 3*2*2;
    dim->v4rho2tau2        = 3*3;
    dim->v4rhosigma2lapl   = 2*6*2;
    dim->v4rhosigma2tau    = 2*6*2;
    dim->v4rhosigmalapl2   = 2*3*3;
    dim->v4rhosigmalapltau = 2*3*2*2;
    dim->v4rhosigmatau2    = 2*3*3;
    dim->v4rholapl3        = 2*4;
    dim->v4rholapl2tau     = 2*3*2;
    dim->v4rholapltau2     = 2*2*3;
    dim->v4rhotau3         = 2*4;
    dim->v4sigma3lapl      = 10*2;
    dim->v4sigma3tau       = 10*2;
    dim->v4sigma2lapl2     = 6*3;
    dim->v4sigma2lapltau   = 6*2*2;
    dim->v4sigma2tau2      = 6*3;
    dim->v4sigmalapl3      = 3*4;
    dim->v4sigmalapl2tau   = 3*3*2;
    dim->v4sigmalapltau2   = 3*2*3;
    dim->v4sigmatau3       = 3*4;
    dim->v4lapl4           = 5;
    dim->v4lapl3tau        = 4*2;
    dim->v4lapl2tau2       = 3*3;
    dim->v4lapltau3        = 2*4;
    dim->v4tau4            = 5;
  }
}